

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void WriteVarInt<DataStream,(VarIntMode)1,short>(DataStream *os,short n)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long in_FS_OFFSET;
  byte bStack_1c;
  uchar tmp [3];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 1;
  for (uVar2 = (ulong)(ushort)n; tmp[lVar3 + -1] = (lVar3 != 1) << 7 | (byte)uVar2 & 0x7f,
      0x7f < (short)uVar2; uVar2 = (ulong)((int)((uVar2 & 0xffff) >> 7) - 1)) {
    lVar3 = lVar3 + 1;
  }
  do {
    ser_writedata8<DataStream>(os,tmp[lVar3 + -1]);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteVarInt(Stream& os, I n)
{
    CheckVarIntMode<Mode, I>();
    unsigned char tmp[(sizeof(n)*8+6)/7];
    int len=0;
    while(true) {
        tmp[len] = (n & 0x7F) | (len ? 0x80 : 0x00);
        if (n <= 0x7F)
            break;
        n = (n >> 7) - 1;
        len++;
    }
    do {
        ser_writedata8(os, tmp[len]);
    } while(len--);
}